

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_at_line_end(Parser *this)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  pcVar1 = (this->m_state->line_contents).rem.str;
  uVar2 = (this->m_state->line_contents).rem.len;
  bVar5 = true;
  if (pcVar1 != (char *)0x0 && uVar2 != 0) {
    if (*pcVar1 != ' ') {
      return false;
    }
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar2 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (pcVar1[uVar4] == ' ');
    bVar5 = uVar2 <= uVar4;
  }
  return bVar5;
}

Assistant:

inline bool _at_line_end() const
    {
        csubstr r = m_state->line_contents.rem;
        return r.empty() || r.begins_with(' ', r.len);
    }